

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib533.c
# Opt level: O3

int test(char *URL)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  timeval tVar11;
  int running;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                  ,0x2c,iVar2,uVar3);
    goto LAB_0010242f;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                  ,0x2e);
    iVar2 = 0x7c;
  }
  else {
    iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
    uVar9 = _stderr;
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x29,1);
      uVar9 = _stderr;
      if (iVar2 == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x2d,1);
        uVar9 = _stderr;
        if (iVar2 == 0) {
          lVar5 = curl_multi_init();
          if (lVar5 == 0) {
            lVar5 = 0;
            curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                          ,0x34);
            iVar2 = 0x7b;
            goto LAB_0010241a;
          }
          iVar2 = curl_multi_add_handle(lVar5,lVar4);
          uVar9 = _stderr;
          if (iVar2 == 0) {
            curl_mfprintf(_stderr,"Start at URL 0\n");
            local_1d0 = -99;
            local_1c8.tv_sec = 1;
            local_1c8.tv_usec = 0;
            iVar2 = curl_multi_perform(lVar5,&local_1cc);
            if (iVar2 == 0) {
              bVar1 = false;
              do {
                if (local_1cc < 0) {
                  pcVar10 = 
                  "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                  ;
                  uVar9 = 0x42;
LAB_001027ec:
                  curl_mfprintf(_stderr,pcVar10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                                ,uVar9);
                  iVar2 = 0x7a;
                  goto LAB_0010241a;
                }
                tVar11 = tutil_tvnow();
                lVar6 = tutil_tvdiff(tVar11,tv_test_start);
                if (60000 < lVar6) {
                  uVar9 = 0x44;
LAB_00102853:
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                                ,uVar9);
                  iVar2 = 0x7d;
                  goto LAB_0010241a;
                }
                if (local_1cc == 0) {
                  if (bVar1) {
                    iVar2 = 0;
                    goto LAB_0010241a;
                  }
                  curl_mfprintf(_stderr,"Advancing to URL 1\n");
                  curl_multi_remove_handle(lVar5,lVar4);
                  curl_easy_reset(lVar4);
                  iVar2 = curl_easy_setopt(lVar4,0x2712,libtest_arg2);
                  uVar9 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_easy_strerror(iVar2);
                    pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar8 = 0x4f;
                    goto LAB_0010240d;
                  }
                  iVar2 = curl_easy_setopt(lVar4,0x29,1);
                  uVar9 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_easy_strerror(iVar2);
                    pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar8 = 0x50;
                    goto LAB_0010240d;
                  }
                  iVar2 = curl_easy_setopt(lVar4,0x2d,1);
                  uVar9 = _stderr;
                  if (iVar2 != 0) {
                    uVar3 = curl_easy_strerror(iVar2);
                    pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar8 = 0x51;
                    goto LAB_0010240d;
                  }
                  iVar2 = curl_multi_add_handle(lVar5,lVar4);
                  uVar9 = _stderr;
                  bVar1 = true;
                  if (iVar2 != 0) {
                    uVar3 = curl_multi_strerror(iVar2);
                    pcVar10 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
                    uVar8 = 0x54;
                    goto LAB_0010240d;
                  }
                }
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                iVar2 = curl_multi_fdset(lVar5,&local_b8,&local_138,&local_1b8,&local_1d0);
                uVar9 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_multi_strerror(iVar2);
                  pcVar10 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                  uVar8 = 0x5e;
                  goto LAB_0010240d;
                }
                if (local_1d0 < -1) {
                  pcVar10 = 
                  "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                  uVar9 = 0x5e;
                  goto LAB_001027ec;
                }
                iVar2 = select_wrapper(local_1d0 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
                if (iVar2 == -1) {
                  piVar7 = __errno_location();
                  uVar9 = _stderr;
                  iVar2 = *piVar7;
                  pcVar10 = strerror(iVar2);
                  curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                                ,0x62,iVar2,pcVar10);
                  iVar2 = 0x79;
                  goto LAB_0010241a;
                }
                tVar11 = tutil_tvnow();
                lVar6 = tutil_tvdiff(tVar11,tv_test_start);
                if (60000 < lVar6) {
                  uVar9 = 100;
                  goto LAB_00102853;
                }
                local_1d0 = -99;
                local_1c8.tv_sec = 1;
                local_1c8.tv_usec = 0;
                iVar2 = curl_multi_perform(lVar5,&local_1cc);
              } while (iVar2 == 0);
            }
            uVar9 = _stderr;
            uVar3 = curl_multi_strerror(iVar2);
            pcVar10 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uVar8 = 0x42;
          }
          else {
            uVar3 = curl_multi_strerror(iVar2);
            pcVar10 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
            uVar8 = 0x36;
          }
        }
        else {
          uVar3 = curl_easy_strerror(iVar2);
          pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar5 = 0;
          uVar8 = 0x32;
        }
      }
      else {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar5 = 0;
        uVar8 = 0x31;
      }
    }
    else {
      uVar3 = curl_easy_strerror(iVar2);
      pcVar10 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar5 = 0;
      uVar8 = 0x30;
    }
LAB_0010240d:
    curl_mfprintf(uVar9,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib533.c"
                  ,uVar8,iVar2,uVar3);
  }
LAB_0010241a:
  curl_easy_cleanup(lVar4);
  curl_multi_cleanup(lVar5);
  curl_global_cleanup();
LAB_0010242f:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int running;
  CURLM *m = NULL;
  int current = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

  multi_init(m);

  multi_add_handle(m, curl);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(!current++) {
        fprintf(stderr, "Advancing to URL 1\n");
        /* remove the handle we use */
        curl_multi_remove_handle(m, curl);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl);
        easy_setopt(curl, CURLOPT_URL, libtest_arg2);
        easy_setopt(curl, CURLOPT_VERBOSE, 1L);
        easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

        /* re-add it */
        multi_add_handle(m, curl);
      }
      else
        break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}